

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O1

EglConfig * __thiscall xe::ri::List::allocItem<xe::ri::EglConfig>(List *this)

{
  EglConfig *pEVar1;
  EglConfig *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pEVar1 = (EglConfig *)operator_new(0x138);
  (pEVar1->super_Item).m_type = TYPE_EGLCONFIG;
  (pEVar1->super_Item)._vptr_Item = (_func_int **)&PTR__EglConfig_00120b68;
  *(undefined8 *)&(pEVar1->super_Item).field_0xc = 0;
  pEVar1->greenSize = 0;
  pEVar1->blueSize = 0;
  *(undefined8 *)((long)&pEVar1->blueSize + 2) = 0;
  *(undefined8 *)((long)&pEVar1->alphaSize + 2) = 0;
  (pEVar1->colorBufferType)._M_dataplus._M_p = (pointer)&(pEVar1->colorBufferType).field_2;
  (pEVar1->colorBufferType)._M_string_length = 0;
  (pEVar1->colorBufferType).field_2._M_local_buf[0] = '\0';
  (pEVar1->configCaveat)._M_dataplus._M_p = (pointer)&(pEVar1->configCaveat).field_2;
  (pEVar1->configCaveat)._M_string_length = 0;
  (pEVar1->configCaveat).field_2._M_local_buf[0] = '\0';
  pEVar1->configID = 0;
  (pEVar1->conformant)._M_dataplus._M_p = (pointer)&(pEVar1->conformant).field_2;
  (pEVar1->conformant)._M_string_length = 0;
  (pEVar1->conformant).field_2._M_local_buf[0] = '\0';
  pEVar1->depthSize = 0;
  pEVar1->level = 0;
  pEVar1->maxPBufferWidth = 0;
  pEVar1->maxPBufferHeight = 0;
  *(undefined8 *)((long)&pEVar1->maxPBufferHeight + 1) = 0;
  *(undefined8 *)((long)&pEVar1->maxSwapInterval + 1) = 0;
  (pEVar1->renderableType)._M_dataplus._M_p = (pointer)&(pEVar1->renderableType).field_2;
  (pEVar1->renderableType)._M_string_length = 0;
  (pEVar1->renderableType).field_2._M_local_buf[0] = '\0';
  pEVar1->sampleBuffers = 0;
  pEVar1->samples = 0;
  pEVar1->stencilSize = 0;
  (pEVar1->surfaceTypes)._M_dataplus._M_p = (pointer)&(pEVar1->surfaceTypes).field_2;
  (pEVar1->surfaceTypes)._M_string_length = 0;
  (pEVar1->surfaceTypes).field_2._M_local_buf[0] = '\0';
  (pEVar1->transparentType)._M_dataplus._M_p = (pointer)&(pEVar1->transparentType).field_2;
  (pEVar1->transparentType)._M_string_length = 0;
  (pEVar1->transparentType).field_2._M_local_buf[0] = '\0';
  pEVar1->transparentRedValue = 0;
  pEVar1->transparentGreenValue = 0;
  pEVar1->transparentBlueValue = 0;
  local_18 = pEVar1;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return pEVar1;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}